

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

double __thiscall mat<3UL,_3UL>::cofactor(mat<3UL,_3UL> *this,size_t row,size_t col)

{
  int iVar1;
  double dVar2;
  mat<2UL,_2UL> local_40;
  size_t local_20;
  size_t col_local;
  size_t row_local;
  mat<3UL,_3UL> *this_local;
  
  local_20 = col;
  col_local = row;
  row_local = (size_t)this;
  get_minor(&local_40,this,row,col);
  dVar2 = mat<2UL,_2UL>::det(&local_40);
  iVar1 = 1;
  if ((col_local + local_20 & 1) != 0) {
    iVar1 = -1;
  }
  return dVar2 * (double)iVar1;
}

Assistant:

double cofactor(const size_t row, const size_t col) const
    {
        return get_minor(row, col).det() * ((row + col) % 2 ? -1 : 1);
    }